

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsCliqueTable.cpp
# Opt level: O1

void __thiscall
HighsCliqueTable::addImplications
          (HighsCliqueTable *this,HighsDomain *domain,HighsInt col,HighsInt val)

{
  double dVar1;
  int iVar2;
  bool bVar3;
  uint uVar4;
  CliqueVar CVar5;
  ulong uVar6;
  double dVar7;
  HighsDomainChange boundchg;
  CliqueVar v;
  anon_class_40_5_13abfe59 doFixings;
  CliqueVar local_54;
  int local_50;
  int local_4c;
  anon_class_40_5_13abfe59 local_48;
  
  local_54 = (CliqueVar)(val << 0x1f | col & 0x7fffffffU);
  iVar2 = (this->colsubstituted).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[col & 0x7fffffffU];
  local_4c = col;
  local_50 = val;
  do {
    if (iVar2 == 0) {
      local_48.v = &local_54;
      local_48.col = &local_4c;
      local_48.val = &local_50;
      local_48.this = this;
      local_48.domain = domain;
      bVar3 = HighsHashTree<int,_int>::
              for_each_recurse<bool,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_coin_or[P]HiGHS_src_mip_HighsCliqueTable_cpp:1871:20)_&,_0>
                        ((NodePtr)(this->invertedHashList).
                                  super__Vector_base<HighsHashTree<int,_int>,_std::allocator<HighsHashTree<int,_int>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start
                                  [(int)((int)local_54 << 1 | (uint)((int)local_54 < 0))].root.
                                  ptrAndType,&local_48);
      if (!bVar3) {
        HighsHashTree<int,_void>::
        for_each_recurse<bool,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_coin_or[P]HiGHS_src_mip_HighsCliqueTable_cpp:1871:20)_&,_0>
                  ((NodePtr)(this->invertedHashListSizeTwo).
                            super__Vector_base<HighsHashTree<int,_void>,_std::allocator<HighsHashTree<int,_void>_>_>
                            ._M_impl.super__Vector_impl_data._M_start
                            [(int)((int)local_54 << 1 | (uint)((int)local_54 < 0))].root.ptrAndType,
                   &local_48);
      }
      return;
    }
    dVar7 = 1.0;
    CVar5 = (this->substitutions).
            super__Vector_base<HighsCliqueTable::Substitution,_std::allocator<HighsCliqueTable::Substitution>_>
            ._M_impl.super__Vector_impl_data._M_start[(long)iVar2 + -1].replace;
    uVar4 = (uint)local_54 & 0x80000000 ^ (uint)CVar5;
    local_54 = (CliqueVar)(uVar4 ^ 0x80000000);
    if ((int)uVar4 < 0) {
      dVar7 = (domain->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[(uint)local_54];
      bVar3 = false;
      if ((dVar7 != 0.0) || (NAN(dVar7))) {
        uVar6 = (ulong)((uint)CVar5 & 0x7fffffff) + 0x100000000;
        dVar7 = 0.0;
        goto LAB_00266643;
      }
    }
    else {
      uVar6 = (ulong)((uint)CVar5 & 0x7fffffff);
      dVar1 = (domain->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[uVar6];
      bVar3 = false;
      if ((dVar1 != 1.0) || (NAN(dVar1))) {
LAB_00266643:
        boundchg.column = (int)uVar6;
        boundchg.boundtype = (int)(uVar6 >> 0x20);
        boundchg.boundval = dVar7;
        HighsDomain::changeBound
                  (domain,boundchg,
                   (Reason)((ulong)(uint)(local_4c * 2 + local_50) << 0x20 | 0xfffffffb));
        bVar3 = true;
        if (domain->infeasible_ == false) {
          bVar3 = false;
        }
      }
    }
    if (bVar3) {
      return;
    }
    iVar2 = (this->colsubstituted).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[(uint)local_54 & 0x7fffffff];
  } while( true );
}

Assistant:

void HighsCliqueTable::addImplications(HighsDomain& domain, HighsInt col,
                                       HighsInt val) {
  CliqueVar v(col, val);

  while (colsubstituted[v.col]) {
    assert((HighsInt)substitutions.size() > colsubstituted[v.col] - 1);
    Substitution subst = substitutions[colsubstituted[v.col] - 1];
    v = v.val == 1 ? subst.replace : subst.replace.complement();
    if (v.val == 1) {
      if (domain.col_lower_[v.col] == 1.0) continue;

      domain.changeBound(HighsBoundType::kLower, v.col, 1.0,
                         HighsDomain::Reason::cliqueTable(col, val));
      if (domain.infeasible()) return;
    } else {
      if (domain.col_upper_[v.col] == 0.0) continue;

      domain.changeBound(HighsBoundType::kUpper, v.col, 0.0,
                         HighsDomain::Reason::cliqueTable(col, val));
      if (domain.infeasible()) return;
    }
  }

  auto doFixings = [&](HighsInt cliqueid) {
    HighsInt start = cliques[cliqueid].start;
    HighsInt end = cliques[cliqueid].end;

    for (HighsInt i = start; i != end; ++i) {
      if (cliqueentries[i].col == v.col) continue;

      if (cliqueentries[i].val == 1) {
        if (domain.col_upper_[cliqueentries[i].col] == 0.0) continue;

        domain.changeBound(HighsBoundType::kUpper, cliqueentries[i].col, 0.0,
                           HighsDomain::Reason::cliqueTable(col, val));
        if (domain.infeasible()) return true;
      } else {
        if (domain.col_lower_[cliqueentries[i].col] == 1.0) continue;

        domain.changeBound(HighsBoundType::kLower, cliqueentries[i].col, 1.0,
                           HighsDomain::Reason::cliqueTable(col, val));
        if (domain.infeasible()) return true;
      }
    }

    return false;
  };

  bool infeas = invertedHashList[v.index()].for_each(doFixings);

  if (infeas) return;

  invertedHashListSizeTwo[v.index()].for_each(doFixings);
}